

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketTest.cpp
# Opt level: O0

void __thiscall TcpSocketTest::handleData(TcpSocketTest *this,Socket *s)

{
  uint uVar1;
  int local_1c;
  int res;
  uint32_t num;
  Socket *s_local;
  TcpSocketTest *this_local;
  
  _res = s;
  s_local = (Socket *)this;
  uVar1 = (**(code **)(*(long *)s + 0x18))(s,&local_1c,4);
  if (uVar1 != 4) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest.cpp"
               ,0x121,"Read Failed %d",(ulong)uVar1);
  }
  local_1c = local_1c + 1;
  uVar1 = (**(code **)(*(long *)_res + 0x20))(_res,&local_1c,4);
  if (uVar1 != 4) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest.cpp"
               ,0x127,"Write Failed %d",(ulong)uVar1);
  }
  return;
}

Assistant:

void TcpSocketTest::handleData( Socket *s )
{
	LOG_NOTICE( "called" );
	uint32_t num;
	
	int res = s->read( &num, 4 );
	
	if ( res != 4 )
		TestFailed( "Read Failed %d", res );

	num += 1;
	res = s->write( &num, 4 );

	if ( res != 4 )
		TestFailed( "Write Failed %d", res );
}